

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ma.c
# Opt level: O2

Integer ma_max_heap_frag_nelem(Integer datatype,Integer min_nelem)

{
  int iVar1;
  AD *address;
  Pointer pcVar2;
  Integer IVar3;
  ulongi length;
  AD **ppAVar4;
  long lVar5;
  
  pcVar2 = ma_partition;
  iVar1 = ma_sizeof[datatype];
  lVar5 = 0;
  ppAVar4 = &ma_hfree;
  while (address = *ppAVar4, address != (AD *)0x0) {
    if (address < pcVar2) {
      length = (long)pcVar2 - (long)address;
      if (address->name + (address->nbytes - 0x10) < pcVar2) {
        length = address->nbytes;
      }
      if (iVar1 * min_nelem + 0x58U <= length) {
        IVar3 = ma_nelem((Pointer)address,length,datatype);
        if (lVar5 < IVar3) {
          lVar5 = IVar3;
        }
      }
    }
    ppAVar4 = &address->next;
  }
  return lVar5;
}

Assistant:

private Integer ma_max_heap_frag_nelem(datatype, min_nelem)
    Integer    datatype;    /* of elements */
    Integer    min_nelem;    /* for fragment to be considered */
{
    ulongi    min_bytes;    /* for fragment to be considered */
    AD        *ad;        /* traversal pointer */
    ulongi    nbytes;        /* in current fragment */
    Integer    nelem;        /* in current fragment */
    Integer    max_nelem;    /* result */

    /* set the threshold */
    min_bytes = (min_nelem * ma_sizeof[datatype]) + BLOCK_OVERHEAD_FIXED;

    /* search the heap free list */
    max_nelem = 0;
    for (ad = ma_hfree; ad; ad = ad->next)
    {
        /*
         * There are 3 cases to consider:
         *
         * (a) fragment is outside heap region
         * (b) fragment straddles partition between heap and stack regions
         * (c) fragment is inside heap region
         */

        if ((Pointer)ad >= ma_partition)
        {
            /* case (a): reject */
            continue;
        }
        else if (((Pointer)ad + ad->nbytes) >= ma_partition)
        {
            /* case (b): truncate fragment at partition */
            nbytes = (ulongi)(ma_partition - (Pointer)ad);
        }
        else
        {
            /* case (c): accept */
            nbytes = ad->nbytes;
        }

        if (nbytes >= min_bytes)
        {
            nelem = ma_nelem((Pointer)ad, nbytes, datatype);
            max_nelem = max(max_nelem, nelem);
        }
    }

    /* return the result */
    return max_nelem;
}